

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int send_ack(quicly_conn_t *conn,st_quicly_pn_space_t *space,quicly_send_context_t *s)

{
  uint64_t *puVar1;
  anon_union_24_13_c7673ae4_for_data *paVar2;
  anon_struct_8_1_89897ddb_for_max_data aVar3;
  int iVar4;
  uint8_t *puVar5;
  st_quicly_sent_block_t *psVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  uint64_t ack_delay;
  long lVar10;
  
  if ((space->ack_queue).num_ranges == 0) {
    return 0;
  }
  lVar10 = (conn->stash).now;
  ack_delay = (lVar10 - space->largest_pn_received_at) * 1000 >> 10;
  if (lVar10 <= space->largest_pn_received_at) {
    ack_delay = 0;
  }
  while( true ) {
    iVar4 = _do_allocate_frame(conn,s,0x12,0);
    if (iVar4 != 0) {
      return iVar4;
    }
    puVar5 = quicly_encode_ack_frame(s->dst,s->dst_end,&space->ack_queue,ack_delay);
    if (puVar5 != (uint8_t *)0x0) break;
    puVar5 = s->dst;
    if (puVar5 == s->dst_payload_from) {
      if ((s->target).first_byte_at == (s->payload_buf).datagram) {
        __assert_fail("s->target.first_byte_at != s->payload_buf.datagram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0xcbc,
                      "int send_ack(quicly_conn_t *, struct st_quicly_pn_space_t *, quicly_send_context_t *)"
                     );
      }
      s->dst = puVar5 + 1;
      *puVar5 = '\0';
    }
    iVar4 = commit_send_packet(conn,s,QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE);
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  puVar1 = &(conn->super).stats.num_frames_sent.ack;
  *puVar1 = *puVar1 + 1;
  uVar7 = (space->ack_queue).num_ranges;
  if (uVar7 < 8) {
LAB_0012110b:
    s->dst = puVar5;
    if (uVar7 == 0) goto LAB_00121183;
  }
  else {
    if ((((conn->egress).packet_number & 3) == 0) && (puVar5 < s->dst_end)) {
      *puVar5 = '\x01';
      puVar1 = &(conn->super).stats.num_frames_sent.ping;
      *puVar1 = *puVar1 + 1;
      puVar5 = puVar5 + 1;
      uVar7 = (space->ack_queue).num_ranges;
      goto LAB_0012110b;
    }
    s->dst = puVar5;
  }
  lVar10 = 0;
  sVar9 = 0;
  do {
    psVar6 = (conn->egress).loss.sentmap.tail;
    if ((psVar6 == (st_quicly_sent_block_t *)0x0) || (sVar8 = psVar6->next_insert_at, sVar8 == 0x10)
       ) {
      psVar6 = quicly_sentmap__new_block(&(conn->egress).loss.sentmap);
      if (psVar6 == (st_quicly_sent_block_t *)0x0) {
        return 0x201;
      }
      sVar8 = psVar6->next_insert_at;
    }
    psVar6->next_insert_at = sVar8 + 1;
    psVar6->num_entries = psVar6->num_entries + 1;
    psVar6->entries[sVar8].acked = on_ack_ack;
    puVar1 = (uint64_t *)((long)&((space->ack_queue).ranges)->start + lVar10);
    aVar3.args = *(quicly_maxsender_sent_t *)(puVar1 + 1);
    paVar2 = &psVar6->entries[sVar8].data;
    (paVar2->packet).packet_number = *puVar1;
    (&paVar2->max_data)[1].args = aVar3.args;
    sVar9 = sVar9 + 1;
    lVar10 = lVar10 + 0x10;
  } while (sVar9 != (space->ack_queue).num_ranges);
LAB_00121183:
  space->unacked_count = 0;
  return 0;
}

Assistant:

static int send_ack(quicly_conn_t *conn, struct st_quicly_pn_space_t *space, quicly_send_context_t *s)
{
    uint64_t ack_delay;
    int ret;

    if (space->ack_queue.num_ranges == 0)
        return 0;

    /* calc ack_delay */
    if (space->largest_pn_received_at < conn->stash.now) {
        /* We underreport ack_delay up to 1 milliseconds assuming that QUICLY_LOCAL_ACK_DELAY_EXPONENT is 10. It's considered a
         * non-issue because our time measurement is at millisecond granurality anyways. */
        ack_delay = ((conn->stash.now - space->largest_pn_received_at) * 1000) >> QUICLY_LOCAL_ACK_DELAY_EXPONENT;
    } else {
        ack_delay = 0;
    }

Emit: /* emit an ACK frame */
    if ((ret = allocate_frame(conn, s, QUICLY_ACK_FRAME_CAPACITY)) != 0)
        return ret;
    uint8_t *dst = s->dst;
    dst = quicly_encode_ack_frame(dst, s->dst_end, &space->ack_queue, ack_delay);

    /* when there's no space, retry with a new MTU-sized packet */
    if (dst == NULL) {
        /* [rare case] A coalesced packet might not have enough space to hold only an ACK. If so, pad it, as that's easier than
         * rolling back. */
        if (s->dst == s->dst_payload_from) {
            assert(s->target.first_byte_at != s->payload_buf.datagram);
            *s->dst++ = QUICLY_FRAME_TYPE_PADDING;
        }
        if ((ret = commit_send_packet(conn, s, QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE)) != 0)
            return ret;
        goto Emit;
    }

    ++conn->super.stats.num_frames_sent.ack;
    QUICLY_PROBE(ACK_SEND, conn, conn->stash.now, space->ack_queue.ranges[space->ack_queue.num_ranges - 1].end - 1, ack_delay);

    /* when there are no less than QUICLY_NUM_ACK_BLOCKS_TO_INDUCE_ACKACK (8) gaps, bundle PING once every 4 packets being sent */
    if (space->ack_queue.num_ranges >= QUICLY_NUM_ACK_BLOCKS_TO_INDUCE_ACKACK && conn->egress.packet_number % 4 == 0 &&
        dst < s->dst_end) {
        *dst++ = QUICLY_FRAME_TYPE_PING;
        ++conn->super.stats.num_frames_sent.ping;
        QUICLY_PROBE(PING_SEND, conn, conn->stash.now);
    }

    s->dst = dst;

    { /* save what's inflight */
        size_t i;
        for (i = 0; i != space->ack_queue.num_ranges; ++i) {
            quicly_sent_t *sent;
            if ((sent = quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_ack_ack)) == NULL)
                return PTLS_ERROR_NO_MEMORY;
            sent->data.ack.range = space->ack_queue.ranges[i];
        }
    }

    space->unacked_count = 0;

    return ret;
}